

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

ags_t AGSSock::send_impl(Socket *sock,char *buf,size_t count)

{
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  
  for (; count != 0; count = count - sVar1) {
    sVar1 = send(sock->id,buf,count,0);
    if (sVar1 == -1) break;
    buf = buf + sVar1;
  }
  piVar2 = __errno_location();
  iVar3 = 0;
  if (*piVar2 != 0xb) {
    iVar3 = *piVar2;
  }
  sock->error = iVar3;
  return (ulong)(count == 0);
}

Assistant:

inline ags_t send_impl(Socket *sock, const char *buf, size_t count)
{
	long ret = 0;
	
	while (count > 0)
	{
		ret = send(sock->id, buf, count, 0);
		if (ret == SOCKET_ERROR)
			break;
		buf += ret;
		count -= ret;
	}
	
	sock->error = GET_ERROR();
	if (WOULD_BLOCK(sock->error))
		sock->error = 0;

	return (ret == SOCKET_ERROR ? 0 : 1);
}